

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

Am_Object GV_undo_handler_from_cmd(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object *in_RSI;
  Am_Object local_60;
  Am_Object local_58;
  undefined1 local_50 [8];
  Am_Value v;
  Am_Object undo_handler;
  Am_Object local_28;
  Am_Object window;
  Am_Object widget;
  Am_Object *cmd_local;
  
  Am_Object::Am_Object(&window);
  Am_Object::Am_Object(&local_28);
  Am_Object::Am_Object((Am_Object *)&v.value);
  Am_Value::Am_Value((Am_Value *)local_50);
  Am_Object::Am_Object(&local_60,in_RSI);
  Am_Get_Selection_Widget_For_Command(&local_58);
  Am_Object::operator=(&window,&local_58);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(&local_60);
  bVar1 = Am_Object::Valid(&window);
  if (bVar1) {
    pAVar2 = Am_Object::Get(&window,0x68,0);
    Am_Object::operator=(&local_28,pAVar2);
  }
  bVar1 = Am_Object::Valid(&local_28);
  if (!bVar1) {
    pAVar2 = Am_Object::Peek(in_RSI,0x170,0);
    Am_Value::operator=((Am_Value *)local_50,pAVar2);
    bVar1 = Am_Value::Valid((Am_Value *)local_50);
    if (bVar1) {
      Am_Object::operator=(&window,(Am_Value *)local_50);
      pAVar2 = Am_Object::Get(&window,0x68,0);
      Am_Object::operator=(&local_28,pAVar2);
    }
  }
  bVar1 = Am_Object::Valid(&local_28);
  if (bVar1) {
    pAVar2 = Am_Object::Peek(&local_28,0x174,0);
    Am_Value::operator=((Am_Value *)local_50,pAVar2);
    bVar1 = Am_Value::Valid((Am_Value *)local_50);
    if (bVar1) {
      Am_Object::Am_Object(cmd,(Am_Value *)local_50);
      goto LAB_0031f15e;
    }
  }
  Am_Object::Am_Object(cmd,&Am_No_Object);
LAB_0031f15e:
  Am_Value::~Am_Value((Am_Value *)local_50);
  Am_Object::~Am_Object((Am_Object *)&v.value);
  Am_Object::~Am_Object(&local_28);
  Am_Object::~Am_Object(&window);
  return (Am_Object)(Am_Object_Data *)cmd;
}

Assistant:

Am_Object
GV_undo_handler_from_cmd(Am_Object cmd)
{
  Am_Object widget, window, undo_handler;
  Am_Value v;
  widget = Am_Get_Selection_Widget_For_Command(cmd);
  if (widget.Valid()) {
    window = widget.Get(Am_WINDOW);
  }
  if (!window.Valid()) {
    v = cmd.Peek(Am_SAVED_OLD_OWNER);
    if (v.Valid()) {
      widget = v;
      window = widget.Get(Am_WINDOW);
    }
  }
  if (window.Valid()) {
    v = window.Peek(Am_UNDO_HANDLER);
    if (v.Valid())
      return v;
  }
  return Am_No_Object;
}